

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O1

void serialization::
     unserialize_unpack<char_const*const*&,serialization::xml_iarchive,std::__cxx11::string,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
               (char ***arg,xml_iarchive *ar,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *front,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
                      *next,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *next_1)

{
  char **ppcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  string local_50;
  
  bVar2 = xml_iarchive::load_key_start_optional(ar,**arg);
  if (bVar2) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    xml_iarchive::load(ar,&local_50);
    std::optional<std::__cxx11::string>::emplace<std::__cxx11::string>
              ((optional<std::__cxx11::string> *)front,&local_50);
    std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
    ::pop_back(&(ar->stack_).c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  ppcVar1 = *arg;
  *arg = ppcVar1 + 1;
  xml_iarchive::load_key_start(ar,ppcVar1[1]);
  unserialize_helper<serialization::xml_iarchive,std::__cxx11::string,Person>(ar,next);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  ppcVar1 = *arg;
  *arg = ppcVar1 + 1;
  xml_iarchive::load_key_start(ar,ppcVar1[1]);
  unserialize_helper<serialization::xml_iarchive,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            (ar,next_1);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  *arg = *arg + 1;
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, std::optional<T> & front, Args&& ... next)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;

    if(ar.load_key_start_optional(key))
    {
        T tmp;
        unserialize_helper(ar, tmp);
        front.emplace(std::move(tmp));
        ar.load_key_end(key);
    }

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}